

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_initialize(REF_GEOM ref_geom)

{
  REF_INT *pRVar1;
  uint uVar2;
  REF_INT *pRVar3;
  long lVar4;
  char *pcVar5;
  undefined8 uStack_20;
  
  ref_geom->n = 0;
  pRVar1 = ref_geom->descr;
  pRVar3 = pRVar1 + 1;
  lVar4 = 0;
  while (lVar4 < ref_geom->max) {
    pRVar3[-1] = -1;
    lVar4 = lVar4 + 1;
    *pRVar3 = (REF_INT)lVar4;
    pRVar3 = pRVar3 + 6;
  }
  pRVar1[ref_geom->max * 6 + -5] = -1;
  ref_geom->blank = 0;
  if ((ref_geom->ref_adj == (REF_ADJ)0x0) || (uVar2 = ref_adj_free(ref_geom->ref_adj), uVar2 == 0))
  {
    uVar2 = ref_adj_create(&ref_geom->ref_adj);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar5 = "create ref_adj for ref_geom";
    uStack_20 = 0x36;
  }
  else {
    pcVar5 = "free to prevent leak";
    uStack_20 = 0x35;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uStack_20,
         "ref_geom_initialize",(ulong)uVar2,pcVar5);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_initialize(REF_GEOM ref_geom) {
  REF_INT geom;
  ref_geom_n(ref_geom) = 0;
  for (geom = 0; geom < ref_geom_max(ref_geom); geom++) {
    ref_geom_type(ref_geom, geom) = REF_EMPTY;
    ref_geom_id(ref_geom, geom) = geom + 1;
  }
  ref_geom_id(ref_geom, ref_geom_max(ref_geom) - 1) = REF_EMPTY;
  ref_geom_blank(ref_geom) = 0;
  if (NULL != (void *)(ref_geom->ref_adj))
    RSS(ref_adj_free(ref_geom->ref_adj), "free to prevent leak");
  RSS(ref_adj_create(&(ref_geom->ref_adj)), "create ref_adj for ref_geom");

  return REF_SUCCESS;
}